

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

IVal * deqp::gls::BuiltinPrecisionTests::
       ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                 (IVal *__return_storage_ptr__,FloatFormat *fmt,Vector<float,_2> *value)

{
  Interval *pIVar1;
  double dVar2;
  bool bVar3;
  long lVar4;
  bool bVar5;
  Interval local_60;
  Interval local_48;
  
  lVar4 = 0;
  __return_storage_ptr__->m_data[0].m_hasNaN = false;
  __return_storage_ptr__->m_data[0].m_lo = INFINITY;
  __return_storage_ptr__->m_data[0].m_hi = -INFINITY;
  __return_storage_ptr__->m_data[1].m_hasNaN = false;
  __return_storage_ptr__->m_data[1].m_lo = INFINITY;
  __return_storage_ptr__->m_data[1].m_hi = -INFINITY;
  bVar3 = true;
  do {
    bVar5 = bVar3;
    dVar2 = (double)value->m_data[lVar4];
    local_60.m_hasNaN = NAN(value->m_data[lVar4]);
    local_60.m_lo = INFINITY;
    if (!local_60.m_hasNaN) {
      local_60.m_lo = dVar2;
    }
    local_60.m_hi = -INFINITY;
    if (!local_60.m_hasNaN) {
      local_60.m_hi = dVar2;
    }
    tcu::FloatFormat::roundOut(&local_48,fmt,&local_60,false);
    __return_storage_ptr__->m_data[lVar4].m_hi = local_48.m_hi;
    pIVar1 = __return_storage_ptr__->m_data + lVar4;
    pIVar1->m_hasNaN = local_48.m_hasNaN;
    *(undefined7 *)&pIVar1->field_0x1 = local_48._1_7_;
    pIVar1->m_lo = local_48.m_lo;
    lVar4 = 1;
    bVar3 = false;
  } while (bVar5);
  return __return_storage_ptr__;
}

Assistant:

static IVal			doRound			(const FloatFormat& fmt, T value)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = round(fmt, value[ndx]);

		return ret;
	}